

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
deregister_coop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
                *this,nonempty_name_t *name,coop_dereg_reason_t dereg_reason)

{
  nonempty_name_t nStack_38;
  
  std::__cxx11::string::string((string *)&nStack_38,(string *)name);
  so_5::impl::coop_repository_basis_t::deregister_coop
            (&(this->m_coop_repo).super_coop_repository_basis_t,&nStack_38,dereg_reason);
  std::__cxx11::string::~string((string *)&nStack_38);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::deregister_coop(
	nonempty_name_t name,
	coop_dereg_reason_t dereg_reason )
	{
		m_coop_repo.deregister_coop( std::move(name), dereg_reason );
	}